

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPredictorTIFFSubStream.cpp
# Opt level: O2

void __thiscall InputPredictorTIFFSubStream::DecodeBufferToColors(InputPredictorTIFFSubStream *this)

{
  byte bVar1;
  Byte *pBVar2;
  unsigned_short *puVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  LongBufferSizeType j;
  ulong uVar9;
  ulong uVar10;
  
  bVar1 = this->mBitsPerComponent;
  uVar5 = (ulong)bVar1;
  if (bVar1 == 8) {
    pBVar2 = this->mRowBuffer;
    uVar9 = this->mReadColorsCount;
    puVar3 = this->mReadColors;
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      puVar3[uVar5] = (ushort)pBVar2[uVar5];
    }
  }
  else if (bVar1 < 8) {
    for (uVar7 = 0; uVar9 = this->mReadColorsCount, uVar7 < uVar5 * uVar9 >> 3; uVar7 = uVar7 + 1) {
      for (uVar9 = 0; uVar9 < (byte)(8 / (byte)uVar5); uVar9 = uVar9 + 1) {
        pBVar2 = this->mRowBuffer;
        this->mReadColors[(uVar7 * 8 + 8) / uVar5 + ~uVar9] = (ushort)pBVar2[uVar7] & this->mBitMask
        ;
        pBVar2[uVar7] = pBVar2[uVar7] >> ((byte)uVar5 & 0x1f);
        uVar5 = (ulong)this->mBitsPerComponent;
      }
    }
  }
  else {
    uVar9 = this->mReadColorsCount;
    puVar3 = this->mReadColors;
    uVar7 = 0;
    for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      puVar3[uVar8] = 0;
      pBVar2 = this->mRowBuffer;
      uVar4 = 0;
      for (uVar10 = 0; bVar1 >> 3 != uVar10; uVar10 = uVar10 + 1) {
        uVar4 = (uint)pBVar2[uVar10 + (uVar7 >> 3)] + ((uVar4 & 0xffff) << (bVar1 & 0x1f));
        puVar3[uVar8] = (unsigned_short)uVar4;
      }
      uVar7 = uVar7 + uVar5;
    }
  }
  puVar3 = this->mReadColors;
  lVar6 = 0;
  for (uVar5 = this->mColors; uVar5 < uVar9; uVar5 = uVar5 + 1) {
    puVar3[uVar5] = *(short *)((long)puVar3 + lVar6) + puVar3[uVar5] & this->mBitMask;
    lVar6 = lVar6 + 2;
  }
  this->mReadColorsIndex = puVar3;
  this->mIndexInColor = '\0';
  return;
}

Assistant:

void InputPredictorTIFFSubStream::DecodeBufferToColors()
{	
	//1. Split to colors. Use array of colors (should be columns * colors). Each time take BitsPerComponent of the buffer
	//2. Once you got the "colors", loop the array, setting values after diffs (use modulo of bit mask for "sign" computing)
	//3. Now you have the colors array. 
	LongBufferSizeType i = 0;

	// read the colors differences according to bits per component
	if(8 == mBitsPerComponent)
	{
		for(; i < mReadColorsCount;++i)
			mReadColors[i] = mRowBuffer[i];
	}
	else if(8 > mBitsPerComponent)
	{
		for(; i < (mReadColorsCount*mBitsPerComponent/8);++i)
		{
			for(LongBufferSizeType j=0; j < (LongBufferSizeType)(8/mBitsPerComponent); ++j)
			{
				mReadColors[(i+1)*8/mBitsPerComponent - j - 1] = mRowBuffer[i] & mBitMask;
				mRowBuffer[i] = mRowBuffer[i]>>mBitsPerComponent;
			}
		}
	}
	else // mBitesPerComponent > 8
	{
		for(; i < mReadColorsCount;++i)
		{
			mReadColors[i] = 0;
			for(Byte j=0;j<mBitsPerComponent/8;++j)
				mReadColors[i] = (mReadColors[i]<<mBitsPerComponent) + mRowBuffer[i*mBitsPerComponent/8 + j];
		}
	}

	// calculate color values according to diffs
	for(i = mColors; i < mReadColorsCount; ++i)
		mReadColors[i] = (mReadColors[i] + mReadColors[i-mColors]) & mBitMask;

	mReadColorsIndex = mReadColors;
	mIndexInColor = 0;

}